

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O3

CURLcode Curl_setblobopt(curl_blob **blobp,curl_blob *blob)

{
  undefined4 uVar1;
  CURLcode CVar2;
  curl_blob *pcVar3;
  size_t sVar4;
  
  (*Curl_cfree)(*blobp);
  *blobp = (curl_blob *)0x0;
  CVar2 = CURLE_OK;
  if (blob != (curl_blob *)0x0) {
    CVar2 = CURLE_BAD_FUNCTION_ARGUMENT;
    if (blob->len < 0x7a1201) {
      sVar4 = 0x18;
      if ((blob->flags & 1) != 0) {
        sVar4 = blob->len + 0x18;
      }
      pcVar3 = (curl_blob *)(*Curl_cmalloc)(sVar4);
      if (pcVar3 == (curl_blob *)0x0) {
        CVar2 = CURLE_OUT_OF_MEMORY;
      }
      else {
        uVar1 = *(undefined4 *)&blob->field_0x14;
        pcVar3->flags = blob->flags;
        *(undefined4 *)&pcVar3->field_0x14 = uVar1;
        sVar4 = blob->len;
        pcVar3->data = blob->data;
        pcVar3->len = sVar4;
        if ((blob->flags & 1) != 0) {
          pcVar3->data = pcVar3 + 1;
          memcpy(pcVar3 + 1,blob->data,blob->len);
        }
        *blobp = pcVar3;
        CVar2 = CURLE_OK;
      }
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_setblobopt(struct curl_blob **blobp,
                         const struct curl_blob *blob)
{
  /* free the previous storage at `blobp' and replace by a dynamic storage
     copy of blob. If CURL_BLOB_COPY is set, the data is copied. */

  Curl_safefree(*blobp);

  if(blob) {
    struct curl_blob *nblob;
    if(blob->len > CURL_MAX_INPUT_LENGTH)
      return CURLE_BAD_FUNCTION_ARGUMENT;
    nblob = (struct curl_blob *)
      malloc(sizeof(struct curl_blob) +
             ((blob->flags & CURL_BLOB_COPY) ? blob->len : 0));
    if(!nblob)
      return CURLE_OUT_OF_MEMORY;
    *nblob = *blob;
    if(blob->flags & CURL_BLOB_COPY) {
      /* put the data after the blob struct in memory */
      nblob->data = (char *)nblob + sizeof(struct curl_blob);
      memcpy(nblob->data, blob->data, blob->len);
    }

    *blobp = nblob;
    return CURLE_OK;
  }

  return CURLE_OK;
}